

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# libfsst.cpp
# Opt level: O3

size_t compressImpl(Encoder *e,size_t nlines,size_t *lenIn,u8 **strIn,size_t size,u8 *output,
                   size_t *lenOut,u8 **strOut,bool noSuffixOpt,bool avoidBranch,int simd)

{
  bool bVar1;
  u16 uVar2;
  ushort uVar3;
  u16 uVar4;
  ushort uVar5;
  element_type *peVar6;
  ulong uVar7;
  u8 *puVar8;
  ulong *puVar9;
  ulong uVar10;
  ulong *puVar11;
  byte bVar12;
  ulong uVar13;
  size_t sVar14;
  uint uVar15;
  ulong __n;
  u8 *puVar16;
  ulong uVar17;
  ushort uStack_268;
  ulong auStack_238 [65];
  
  peVar6 = (e->symbolTable).super___shared_ptr<SymbolTable,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
  uVar2 = peVar6->nSymbols;
  uVar3 = peVar6->suffixLim;
  bVar1 = peVar6->zeroTerminated;
  uVar4 = peVar6->lenHisto[0];
  switchD_00569a20::default(auStack_238,0,0x207);
  if (nlines == 0) {
    nlines = 0;
  }
  else {
    uStack_268._0_1_ = (char)uVar4;
    bVar12 = (bVar1 + (char)uVar2) - (char)uStack_268;
    sVar14 = 0;
    puVar16 = output;
    do {
      strOut[sVar14] = puVar16;
      uVar17 = lenIn[sVar14];
      uVar13 = 0;
      do {
        __n = uVar17 - uVar13;
        if (0x1fe < __n) {
          __n = 0x1ff;
        }
        if (output + (size - (long)puVar16) < (u8 *)((__n & 0xffffffff) * 2 + 7)) {
          return sVar14;
        }
        switchD_00b041bd::default(auStack_238,strIn[sVar14] + uVar13,__n);
        puVar9 = (ulong *)((long)auStack_238 + __n);
        *(char *)puVar9 = (char)peVar6->terminator;
        uStack_268 = (ushort)bVar12;
        if (noSuffixOpt) {
          if (uVar17 != uVar13) {
            puVar11 = auStack_238;
            do {
              uVar17 = *puVar11;
              uVar5 = peVar6->shortCodes[uVar17 & 0xffff];
              if ((uVar5 & 0xff) < uVar3) {
                *puVar16 = (u8)uVar5;
                uVar10 = 2;
                puVar8 = puVar16 + 1;
              }
              else {
                uVar15 = ((uint)uVar17 & 0xffffff) * -0x4ee6db1f;
                uVar10 = (ulong)(((uVar15 >> 0xf ^ uVar15) & 0x3ff) << 4);
                uVar7 = *(ulong *)((long)&peVar6->hashTab[0].val + uVar10);
                uVar10 = *(ulong *)((long)&peVar6->hashTab[0].icl + uVar10);
                puVar16[1] = (u8)uVar17;
                puVar8 = puVar16 + 1;
                if ((uVar10 < 0xf1ff0000) &&
                   (uVar7 == (uVar17 << ((byte)uVar10 & 0x3f)) >> ((byte)uVar10 & 0x3f))) {
                  *puVar16 = (u8)(uVar10 >> 0x10);
                  uVar10 = uVar10 >> 0x1c;
                }
                else {
                  *puVar16 = (u8)uVar5;
                  uVar10 = 2;
                  if (uStack_268 <= (uVar5 & 0xff)) {
                    uVar10 = 1;
                    puVar8 = puVar16 + (ulong)((uVar5 >> 8 & 1) != 0) + 1;
                  }
                }
              }
              puVar16 = puVar8;
              puVar11 = (ulong *)((long)puVar11 + uVar10);
            } while (puVar11 < puVar9);
          }
        }
        else if (avoidBranch) {
          if (uVar17 != uVar13) {
            puVar11 = auStack_238;
            do {
              uVar17 = *puVar11;
              uVar5 = peVar6->shortCodes[uVar17 & 0xffff];
              uVar15 = ((uint)uVar17 & 0xffffff) * -0x4ee6db1f;
              uVar10 = (ulong)(((uVar15 >> 0xf ^ uVar15) & 0x3ff) << 4);
              uVar7 = *(ulong *)((long)&peVar6->hashTab[0].val + uVar10);
              uVar10 = *(ulong *)((long)&peVar6->hashTab[0].icl + uVar10);
              puVar16[1] = (u8)uVar17;
              if ((uVar10 < 0xf1ff0000) &&
                 (uVar7 == (uVar17 << ((byte)uVar10 & 0x3f)) >> ((byte)uVar10 & 0x3f))) {
                *puVar16 = (u8)(uVar10 >> 0x10);
                puVar16 = puVar16 + 1;
                uVar10 = uVar10 >> 0x1c;
              }
              else {
                *puVar16 = (u8)uVar5;
                puVar16 = puVar16 + (ulong)((uVar5 >> 8 & 1) != 0) + 1;
                uVar10 = (ulong)(uVar5 >> 0xc);
              }
              puVar11 = (ulong *)((long)puVar11 + uVar10);
            } while (puVar11 < puVar9);
          }
        }
        else if (uVar17 != uVar13) {
          puVar11 = auStack_238;
          do {
            uVar17 = *puVar11;
            uVar5 = peVar6->shortCodes[uVar17 & 0xffff];
            uVar15 = ((uint)uVar17 & 0xffffff) * -0x4ee6db1f;
            uVar10 = (ulong)(((uVar15 >> 0xf ^ uVar15) & 0x3ff) << 4);
            uVar7 = *(ulong *)((long)&peVar6->hashTab[0].val + uVar10);
            uVar10 = *(ulong *)((long)&peVar6->hashTab[0].icl + uVar10);
            puVar16[1] = (u8)uVar17;
            puVar8 = puVar16 + 1;
            if ((uVar10 < 0xf1ff0000) &&
               (uVar7 == (uVar17 << ((byte)uVar10 & 0x3f)) >> ((byte)uVar10 & 0x3f))) {
              *puVar16 = (u8)(uVar10 >> 0x10);
              uVar10 = uVar10 >> 0x1c;
            }
            else {
              *puVar16 = (u8)uVar5;
              uVar10 = 2;
              if (uStack_268 <= (uVar5 & 0xff)) {
                uVar10 = 1;
                puVar8 = puVar16 + (ulong)((uVar5 >> 8 & 1) != 0) + 1;
              }
            }
            puVar16 = puVar8;
            puVar11 = (ulong *)((long)puVar11 + uVar10);
          } while (puVar11 < puVar9);
        }
        uVar13 = uVar13 + __n;
        uVar17 = lenIn[sVar14];
      } while (uVar13 < uVar17);
      lenOut[sVar14] = (long)puVar16 - (long)strOut[sVar14];
      sVar14 = sVar14 + 1;
    } while (sVar14 != nlines);
  }
  return nlines;
}

Assistant:

inline size_t _compressImpl(Encoder *e, size_t nlines, size_t lenIn[], u8 *strIn[], size_t size, u8 *output, size_t *lenOut, u8 *strOut[], bool noSuffixOpt, bool avoidBranch, int) {
	return compressBulk(*e->symbolTable, nlines, lenIn, strIn, size, output, lenOut, strOut, noSuffixOpt, avoidBranch);
}